

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode-t32.inc.c
# Opt level: O0

void disas_t32_extract_S_xrr_shi(DisasContext_conflict1 *ctx,arg_s_rrr_shi *a,uint32_t insn)

{
  uint32_t uVar1;
  uint32_t fieldval;
  uint32_t insn_local;
  arg_s_rrr_shi *a_local;
  DisasContext_conflict1 *ctx_local;
  
  uVar1 = extract32(insn,0x10,4);
  a->rn = uVar1;
  uVar1 = extract32(insn,4,2);
  a->shty = uVar1;
  uVar1 = extract32(insn,0,4);
  a->rm = uVar1;
  uVar1 = extract32(insn,6,2);
  fieldval = extract32(insn,0xc,3);
  uVar1 = deposit32(uVar1,2,0x1e,fieldval);
  a->shim = uVar1;
  a->s = 1;
  a->rd = 0;
  return;
}

Assistant:

static void disas_t32_extract_S_xrr_shi(DisasContext *ctx, arg_s_rrr_shi *a, uint32_t insn)
{
    a->rn = extract32(insn, 16, 4);
    a->shty = extract32(insn, 4, 2);
    a->rm = extract32(insn, 0, 4);
    a->shim = deposit32(extract32(insn, 6, 2), 2, 30, extract32(insn, 12, 3));
    a->s = 1;
    a->rd = 0;
}